

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.h
# Opt level: O2

void __thiscall
yyml::nn::Variable<double>::Variable(Variable<double> *this,Variable<double> *param_1)

{
  Tensor<double>::Tensor(&this->values_,&param_1->values_);
  Tensor<double>::Tensor(&this->grads_,&param_1->grads_);
  Autograd<double>::Autograd(&this->autograd_,&param_1->autograd_);
  std::__cxx11::string::string((string *)&this->name_,(string *)&param_1->name_);
  return;
}

Assistant:

Variable(TensorShape shape)
      : values_(shape),
        grads_(shape),
        autograd_({}, this, nullptr),
        name_("") {}